

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::HashSetResizeHelper::
GrowSizeIntoSingleGroup<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::SourceCodeInfo_Location_const*>,void>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::SourceCodeInfo_Location_const*>>>
          (HashSetResizeHelper *this,CommonFields *c,
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>
          *alloc_ref)

{
  slot_type *old_slot;
  ctrl_t *pcVar1;
  ulong uVar2;
  slot_type *new_slot;
  
  if (7 < this->old_capacity_) {
    __assert_fail("(old_capacity_ < Group::kWidth / 2) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x856,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, const google::protobuf::SourceCodeInfo_Location *>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::SourceCodeInfo_Location *>>]"
                 );
  }
  if ((c->capacity_ < 0x11) && (this->old_capacity_ < c->capacity_)) {
    new_slot = (slot_type *)(c->heap_or_soo_).heap.slot_array.p;
    old_slot = (slot_type *)old_slots(this);
    pcVar1 = old_ctrl(this);
    for (uVar2 = 0; new_slot = new_slot + 1, uVar2 < this->old_capacity_; uVar2 = uVar2 + 1) {
      if (kSentinel < pcVar1[uVar2]) {
        map_slot_policy<std::__cxx11::string,google::protobuf::SourceCodeInfo_Location_const*>::
        transfer<std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::SourceCodeInfo_Location_const*>>>
                  (alloc_ref,new_slot,old_slot);
      }
      old_slot = old_slot + 1;
    }
    return;
  }
  __assert_fail("(IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity())) && \"Try enabling sanitizers.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x858,
                "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, const google::protobuf::SourceCodeInfo_Location *>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::SourceCodeInfo_Location *>>]"
               );
}

Assistant:

void GrowSizeIntoSingleGroup(CommonFields& c, Alloc& alloc_ref) {
    ABSL_SWISSTABLE_ASSERT(old_capacity_ < Group::kWidth / 2);
    ABSL_SWISSTABLE_ASSERT(
        IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity()));
    using slot_type = typename PolicyTraits::slot_type;
    ABSL_SWISSTABLE_ASSERT(is_single_group(c.capacity()));

    auto* new_slots = static_cast<slot_type*>(c.slot_array()) + 1;
    auto* old_slots_ptr = static_cast<slot_type*>(old_slots());
    auto* old_ctrl_ptr = old_ctrl();

    for (size_t i = 0; i < old_capacity_; ++i, ++new_slots) {
      if (IsFull(old_ctrl_ptr[i])) {
        SanitizerUnpoisonMemoryRegion(new_slots, sizeof(slot_type));
        PolicyTraits::transfer(&alloc_ref, new_slots, old_slots_ptr + i);
      }
    }
    PoisonSingleGroupEmptySlots(c, sizeof(slot_type));
  }